

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderTimestamp
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  StringPiece default_string;
  bool bVar1;
  stringpiece_ssize_type sVar2;
  AlphaNum *in_RCX;
  string *this;
  StringPiece error_message;
  StringPiece error_message_00;
  AlphaNum local_108;
  StringPiece local_d8;
  StringPiece local_c8;
  StringPiece local_b8;
  DataPiece local_a8;
  undefined1 auStack_78 [8];
  StringPiece value;
  string local_58;
  size_type local_38;
  int64 seconds;
  int32 nanos;
  
  if (data->type_ == TYPE_STRING) {
    _auStack_78 = DataPiece::str(data);
    StringPiece::ToString_abi_cxx11_((string *)&local_a8,(StringPiece *)auStack_78);
    bVar1 = protobuf::internal::ParseTime
                      ((string *)&local_a8,(int64 *)&local_38,(int32 *)((long)&seconds + 4));
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      StringPiece::StringPiece(&local_c8,"seconds");
      local_a8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_a8.type_ = TYPE_INT64;
      local_a8.field_2.i64_ = local_38;
      local_a8.use_strict_base64_decoding_ = false;
      ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_c8,&local_a8);
      StringPiece::StringPiece(&local_b8,"nanos");
      local_a8._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_a8.type_ = TYPE_INT32;
      local_a8.field_2.i32_ = seconds._4_4_;
      local_a8.use_strict_base64_decoding_ = false;
      ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_b8,&local_a8);
      goto LAB_00339a47;
    }
    local_a8._vptr_DataPiece = (_func_int **)0x36e364;
    local_a8.type_ = 0x15;
    local_a8._12_4_ = 0;
    local_108.piece_data_ = (char *)auStack_78;
    local_108.piece_size_ = (size_t)value.ptr_;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_a8,&local_108,in_RCX);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_58._M_string_length);
    error_message_00.length_ = sVar2;
    error_message_00.ptr_ = local_58._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message_00);
    this = &local_58;
  }
  else {
    if (data->type_ == TYPE_NULL) {
LAB_00339a47:
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_a8._vptr_DataPiece = (_func_int **)0x36e339;
    local_a8.type_ = 0x2a;
    local_a8._12_4_ = 0;
    StringPiece::StringPiece(&local_d8,"");
    default_string.length_ = local_d8.length_;
    default_string.ptr_ = local_d8.ptr_;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_((string *)auStack_78,data,default_string);
    local_108.piece_data_ = (char *)auStack_78;
    local_108.piece_size_ = (size_t)value.ptr_;
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_a8,&local_108,(AlphaNum *)local_d8.length_);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_58._M_string_length);
    error_message.length_ = sVar2;
    error_message.ptr_ = local_58._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_58);
    this = (string *)auStack_78;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderTimestamp(ProtoStreamObjectWriter* ow,
                                                const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for timestamp, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  StringPiece value(data.str());

  int64 seconds;
  int32 nanos;
  if (!::google::protobuf::internal::ParseTime(value.ToString(), &seconds,
                                               &nanos)) {
    return Status(INVALID_ARGUMENT, StrCat("Invalid time format: ", value));
  }


  ow->ProtoWriter::RenderDataPiece("seconds", DataPiece(seconds));
  ow->ProtoWriter::RenderDataPiece("nanos", DataPiece(nanos));
  return Status();
}